

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O0

CURLcode easysrc_add(curl_slist **plist,char *line)

{
  curl_slist *pcVar1;
  curl_slist *list;
  CURLcode ret;
  char *line_local;
  curl_slist **plist_local;
  
  list._4_4_ = CURLE_OK;
  pcVar1 = (curl_slist *)curl_slist_append(*plist,line);
  if (pcVar1 == (curl_slist *)0x0) {
    easysrc_free();
    list._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    *plist = pcVar1;
  }
  return list._4_4_;
}

Assistant:

CURLcode easysrc_add(struct curl_slist **plist, const char *line)
{
  CURLcode ret = CURLE_OK;
  struct curl_slist *list =
    curl_slist_append(*plist, line);
  if(!list) {
    easysrc_free();
    ret = CURLE_OUT_OF_MEMORY;
  }
  else
    *plist = list;
  return ret;
}